

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O3

void __thiscall xray_re::xr_skl_motion::save(xr_skl_motion *this,xr_writer *w)

{
  pointer ppxVar1;
  pointer ppxVar2;
  undefined8 in_RAX;
  pointer ppxVar3;
  pointer ppxVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xr_motion::save(&this->super_xr_motion,w);
  uStack_28 = CONCAT26(uStack_28._6_2_,
                       (uint6)CONCAT14((this->m_marks).
                                       super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start ==
                                       (this->m_marks).
                                       super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                       (undefined4)uStack_28)) ^ 0x700000000;
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,2);
  uStack_28._0_5_ = CONCAT14((char)this->m_flags,(undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,1);
  uStack_28._0_6_ = CONCAT24(this->m_bone_or_part,(undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,2);
  uStack_28 = CONCAT44(this->m_speed,(undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,4);
  uStack_28 = CONCAT44(this->m_accrue,(undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,4);
  uStack_28 = CONCAT44(this->m_falloff,(undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,4);
  uStack_28 = CONCAT44(this->m_power,(undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,4);
  uStack_28._0_6_ =
       CONCAT24((short)((uint)(*(int *)&(this->m_bone_motions).
                                        super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                              *(int *)&(this->m_bone_motions).
                                       super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3),
                (undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,2);
  ppxVar1 = (this->m_bone_motions).
            super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar3 = (this->m_bone_motions).
                 super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppxVar3 != ppxVar1;
      ppxVar3 = ppxVar3 + 1) {
    xr_bone_motion::save(*ppxVar3,w);
  }
  ppxVar4 = (this->m_marks).
            super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppxVar2 = (this->m_marks).
            super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppxVar4 != ppxVar2) {
    uStack_28 = CONCAT44((int)((ulong)((long)ppxVar2 - (long)ppxVar4) >> 3),(undefined4)uStack_28);
    (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,4);
    ppxVar2 = (this->m_marks).
              super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppxVar4 = (this->m_marks).
                   super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppxVar4 != ppxVar2;
        ppxVar4 = ppxVar4 + 1) {
      xr_motion_marks::save(*ppxVar4,w);
    }
  }
  return;
}

Assistant:

void xr_skl_motion::save(xr_writer& w) const
{
	xr_motion::save(w);
	w.w_u16(m_marks.empty()? SMOTION_VERSION_6 : SMOTION_VERSION_7);
	w.w_u8(uint8_t(m_flags & 0xff));
	w.w_u16(m_bone_or_part);
	w.w_float(m_speed);
	w.w_float(m_accrue);
	w.w_float(m_falloff);
	w.w_float(m_power);
	w.w_size_u16(m_bone_motions.size());
	w.w_seq(m_bone_motions, xr_writer::f_w_const<xr_bone_motion>(&xr_bone_motion::save));
	
	// save marks
	if (!m_marks.empty()) {
		w.w_size_u32(m_marks.size());
		w.w_seq(m_marks, xr_writer::f_w_const<xr_motion_marks>(&xr_motion_marks::save));
	}
}